

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

void BeginVisitBlock(ParseNodeBlock *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Scope *this;
  bool bVar1;
  uint index;
  FuncInfo *this_00;
  FuncInfo *func;
  Scope *scope;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeBlock *pnode_local;
  
  bVar1 = BlockHasOwnScope(pnode,byteCodeGenerator);
  if (bVar1) {
    this = pnode->scope;
    this_00 = Scope::GetFunc(this);
    bVar1 = Scope::IsInnerScope(this);
    if (bVar1) {
      index = FuncInfo::AcquireInnerScopeIndex(this_00);
      Scope::SetInnerScopeIndex(this,index);
    }
    ByteCodeGenerator::PushBlock(byteCodeGenerator,pnode);
    ByteCodeGenerator::PushScope(byteCodeGenerator,pnode->scope);
  }
  return;
}

Assistant:

void BeginVisitBlock(ParseNodeBlock *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    if (BlockHasOwnScope(pnode, byteCodeGenerator))
    {
        Scope *scope = pnode->scope;
        FuncInfo *func = scope->GetFunc();

        if (scope->IsInnerScope())
        {
            // Give this scope an index so its slots can be accessed via the index in the byte code,
            // not a register.
            scope->SetInnerScopeIndex(func->AcquireInnerScopeIndex());
        }

        byteCodeGenerator->PushBlock(pnode);
        byteCodeGenerator->PushScope(pnode->scope);
    }
}